

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SetEnumValue
          (Reflection *this,Message *message,FieldDescriptor *field,int value)

{
  byte bVar1;
  Descriptor *pDVar2;
  bool bVar3;
  EnumDescriptor *this_00;
  EnumValueDescriptor *pEVar4;
  UnknownFieldSet *this_01;
  char *description;
  Metadata MVar5;
  
  MVar5 = Message::GetMetadata(message);
  if (MVar5.reflection != this) {
LAB_0025a0e5:
    pDVar2 = this->descriptor_;
    MVar5 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError(pDVar2,MVar5.descriptor,field,"SetEnumValue");
  }
  pDVar2 = this->descriptor_;
  if (field->containing_type_ == pDVar2) {
    bVar1 = field->field_0x1;
    if (0xbf < bVar1 != (bool)((bVar1 & 0x20) >> 5)) {
      SetEnumValue();
      goto LAB_0025a0e5;
    }
    if ((bVar1 & 0x20) == 0) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 8) {
        anon_unknown_6::ReportReflectionUsageTypeError(pDVar2,field,"SetEnumValue",CPPTYPE_ENUM);
      }
      bVar3 = FieldDescriptor::legacy_enum_field_treated_as_closed(field);
      if (bVar3) {
        this_00 = FieldDescriptor::enum_type(field);
        pEVar4 = EnumDescriptor::FindValueByNumber(this_00,value);
        if (pEVar4 == (EnumValueDescriptor *)0x0) {
          this_01 = MutableUnknownFields(this,message);
          UnknownFieldSet::AddVarint(this_01,field->number_,(long)value);
          return;
        }
      }
      SetEnumValueInternal(this,message,field,value);
      return;
    }
    description = "Field is repeated; the method requires a singular field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar2,field,"SetEnumValue",description);
}

Assistant:

void Reflection::SetEnumValue(Message* message, const FieldDescriptor* field,
                              int value) const {
  USAGE_MUTABLE_CHECK_ALL(SetEnumValue, SINGULAR, ENUM);
  if (!CreateUnknownEnumValues(field)) {
    // Check that the value is valid if we don't support direct storage of
    // unknown enum values.
    const EnumValueDescriptor* value_desc =
        field->enum_type()->FindValueByNumber(value);
    if (value_desc == nullptr) {
      MutableUnknownFields(message)->AddVarint(field->number(), value);
      return;
    }
  }
  SetEnumValueInternal(message, field, value);
}